

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v9::basic_printf_context<fmt::v9::appender,_char>,_char_*> * __thiscall
fmt::v9::make_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,char>,char*const&>
          (format_arg_store<fmt::v9::basic_printf_context<fmt::v9::appender,_char>,_char_*>
           *__return_storage_ptr__,v9 *this,char **args)

{
  char **args_local;
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  char_type **arg;
  
  return (format_arg_store<fmt::v9::basic_printf_context<fmt::v9::appender,_char>,_char_*> *)
         (__return_storage_ptr__->data_).args_[0].field_0.long_long_value;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {FMT_FORWARD(args)...};
}